

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O0

int asn1_bit_string_length(ASN1_BIT_STRING *str,uint8_t *out_padding_bits)

{
  bool bVar1;
  byte local_30;
  byte local_25;
  int local_24;
  uint8_t last;
  uint8_t padding_bits;
  int len;
  uint8_t *out_padding_bits_local;
  ASN1_BIT_STRING *str_local;
  
  local_24 = str->length;
  if ((str->flags & 8U) == 0) {
    while( true ) {
      bVar1 = false;
      if (0 < local_24) {
        bVar1 = str->data[local_24 + -1] == '\0';
      }
      if (!bVar1) break;
      local_24 = local_24 + -1;
    }
    local_25 = 0;
    if (0 < local_24) {
      if (str->data[local_24 + -1] == 0) {
        __assert_fail("last != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                      ,0x32,"int asn1_bit_string_length(const ASN1_BIT_STRING *, uint8_t *)");
      }
      for (; (local_25 < 7 && (((uint)str->data[local_24 + -1] & 1 << (local_25 & 0x1f)) == 0));
          local_25 = local_25 + 1) {
      }
    }
    *out_padding_bits = local_25;
    str_local._4_4_ = local_24;
  }
  else {
    if (local_24 == 0) {
      local_30 = 0;
    }
    else {
      local_30 = (byte)str->flags & 7;
    }
    *out_padding_bits = local_30;
    str_local._4_4_ = local_24;
  }
  return str_local._4_4_;
}

Assistant:

int asn1_bit_string_length(const ASN1_BIT_STRING *str,
                           uint8_t *out_padding_bits) {
  int len = str->length;
  if (str->flags & ASN1_STRING_FLAG_BITS_LEFT) {
    // If the string is already empty, it cannot have padding bits.
    *out_padding_bits = len == 0 ? 0 : str->flags & 0x07;
    return len;
  }

  // TODO(https://crbug.com/boringssl/447): If we move this logic to
  // |ASN1_BIT_STRING_set_bit|, can we remove this representation?
  while (len > 0 && str->data[len - 1] == 0) {
    len--;
  }
  uint8_t padding_bits = 0;
  if (len > 0) {
    uint8_t last = str->data[len - 1];
    assert(last != 0);
    for (; padding_bits < 7; padding_bits++) {
      if (last & (1 << padding_bits)) {
        break;
      }
    }
  }
  *out_padding_bits = padding_bits;
  return len;
}